

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageInputTest.cpp
# Opt level: O2

void __thiscall imageInput_invalidFile_Test::TestBody(imageInput_invalidFile_Test *this)

{
  ReaderWriterMock *this_00;
  MockSpec<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *pMVar1;
  TypedExpectation<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *pTVar2;
  ostream *poVar3;
  Mat *this_01;
  long local_570;
  ifstream infile;
  int aiStack_550 [122];
  Mat local_368 [96];
  Mat local_308 [96];
  undefined1 local_2a8 [8];
  ImageInput imageInput;
  Mat m;
  int local_234;
  string local_e0 [32];
  string local_c0 [8];
  string fileName;
  Mat z;
  linked_ptr<cv::Mat> local_40;
  linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
  local_30;
  
  cv::Mat::Mat((Mat *)local_2a8);
  this_00 = (ReaderWriterMock *)operator_new(0x158);
  memset(this_00,0,0x158);
  ReaderWriterMock::ReaderWriterMock(this_00);
  imageInput._88_8_ = &this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x30);
  std::__cxx11::string::string(local_c0,"../test/23_Human.jpg",(allocator *)&local_570);
  std::ifstream::ifstream(&local_570,local_c0,_S_in);
  if (*(int *)((long)aiStack_550 + *(long *)(local_570 + -0x18)) == 0) {
    cv::Mat::zeros((int)&imageInput + 0x60,0x2d0,0x500);
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)(fileName.field_2._M_local_buf + 8));
    cv::MatExpr::~MatExpr((MatExpr *)&imageInput.reader);
    testing::A<std::__cxx11::string>();
    pMVar1 = ReaderWriterMock::gmock_read
                       (this_00,(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&imageInput.reader);
    pTVar2 = testing::internal::
             MockSpec<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             ::InternalExpectedAt
                       (pMVar1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/ImageInputTest.cpp"
                        ,0x3b,"*readerMock","read(_)");
    cv::Mat::Mat(local_368,(Mat *)(fileName.field_2._M_local_buf + 8));
    testing::Return<cv::Mat>((Mat *)&local_40);
    testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_30);
    testing::internal::
    TypedExpectation<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::WillRepeatedly(pTVar2,(Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_30);
    testing::internal::
    linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
    ::~linked_ptr(&local_30);
    testing::internal::linked_ptr<cv::Mat>::~linked_ptr(&local_40);
    cv::Mat::~Mat(local_368);
    testing::internal::
    MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&imageInput.reader);
    this_01 = (Mat *)(fileName.field_2._M_local_buf + 8);
  }
  else {
    cv::Mat::Mat((Mat *)&imageInput.reader);
    testing::A<std::__cxx11::string>();
    pMVar1 = ReaderWriterMock::gmock_read
                       (this_00,(Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)((long)&fileName.field_2 + 8));
    pTVar2 = testing::internal::
             MockSpec<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             ::InternalExpectedAt
                       (pMVar1,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/ImageInputTest.cpp"
                        ,0x40,"*readerMock","read(_)");
    cv::Mat::Mat(local_308,(Mat *)&imageInput.reader);
    testing::Return<cv::Mat>((Mat *)&local_40);
    testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_30);
    testing::internal::
    TypedExpectation<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::WillRepeatedly(pTVar2,(Action<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_30);
    testing::internal::
    linked_ptr<testing::ActionInterface<cv::Mat_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>
    ::~linked_ptr(&local_30);
    testing::internal::linked_ptr<cv::Mat>::~linked_ptr(&local_40);
    cv::Mat::~Mat(local_308);
    testing::internal::
    MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~MatcherBase((MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&fileName.field_2 + 8));
    this_01 = (Mat *)&imageInput.reader;
  }
  cv::Mat::~Mat(this_01);
  std::__cxx11::string::string(local_e0,local_c0);
  ImageInput::readImage((ImageInput *)&imageInput.reader,(string *)local_2a8);
  std::__cxx11::string::~string(local_e0);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,_m);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_234);
  std::endl<char,std::char_traits<char>>(poVar3);
  testing::Message::Message((Message *)((long)&fileName.field_2 + 8));
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_30,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/ImageInputTest.cpp"
             ,0x48,"Failed");
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_30,(Message *)((long)&fileName.field_2 + 8));
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&fileName.field_2 + 8));
  cv::Mat::~Mat((Mat *)&imageInput.reader);
  std::ifstream::~ifstream(&local_570);
  std::__cxx11::string::~string(local_c0);
  cv::Mat::~Mat((Mat *)local_2a8);
  return;
}

Assistant:

TEST(imageInput, invalidFile) {
  /// Instantiate objects for various classes
  ImageInput imageInput;
  ReaderWriterMock* readerMock = new ReaderWriterMock();
  /// Set mock to read images
  imageInput.setReader(readerMock);
  /// Declare file path
  const std::string fileName = "../test/23_Human.jpg";
  /// Add mock implementation to check validity of image file path
  std::ifstream infile(fileName);
  if (infile.good()) {
    /// If file path exist then return full mat file
    cv::Mat z = cv::Mat::zeros(720, 1280, CV_8U);
    EXPECT_CALL(*readerMock, read(_)).WillRepeatedly(
      Return(z));
  } else {
      /// If file path does not exist then return empty mat file
    cv::Mat m;
    EXPECT_CALL(*readerMock, read(_)).WillRepeatedly(
      Return(m));
  }

  try {
    /// try to read image
    cv::Mat result = imageInput.readImage(fileName);
    std::cout << result.rows << " " << result.cols << std::endl;
    FAIL();  // Expected std::invalid file path exception
  }
  catch(std::exception& err) {
    EXPECT_EQ(err.what(), std::string("Invalid File Path"));
  }
  /// delete mock object
  delete readerMock;
}